

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

int __thiscall ON_Xform::SignOfDeterminant(ON_Xform *this,bool bFastTest)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  int iVar7;
  undefined7 in_register_00000031;
  double dVar8;
  double dVar9;
  double min_pivot;
  
  if (((int)CONCAT71(in_register_00000031,bFastTest) != 0) &&
     (((((dVar9 = this->m_xform[3][0], dVar9 == 0.0 && (!NAN(dVar9))) &&
        (dVar9 = this->m_xform[3][1], dVar9 == 0.0)) &&
       (((!NAN(dVar9) && (dVar9 = this->m_xform[3][2], dVar9 == 0.0)) && (!NAN(dVar9))))) ||
      (((dVar9 = this->m_xform[0][3], dVar9 == 0.0 && (!NAN(dVar9))) &&
       ((dVar9 = this->m_xform[1][3], dVar9 == 0.0 &&
        (((!NAN(dVar9) && (dVar9 = this->m_xform[2][3], dVar9 == 0.0)) && (!NAN(dVar9))))))))))) {
    dVar9 = this->m_xform[3][3];
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      dVar8 = this->m_xform[1][0];
      dVar1 = this->m_xform[1][1];
      dVar2 = this->m_xform[2][2];
      dVar3 = this->m_xform[1][2];
      dVar4 = this->m_xform[2][1];
      dVar5 = this->m_xform[2][0];
      dVar8 = (dVar8 * dVar4 - dVar5 * dVar1) * this->m_xform[0][2] +
              (dVar1 * dVar2 - dVar4 * dVar3) * this->m_xform[0][0] +
              (dVar3 * dVar5 - dVar2 * dVar8) * this->m_xform[0][1];
      if ((dVar8 != 0.0) || (NAN(dVar8))) {
        if (1e-08 < ABS(dVar8)) {
          bVar6 = 0.0 <= dVar9;
          iVar7 = (bVar6 - 1) + (uint)bVar6;
          if (dVar8 < 0.0) {
            iVar7 = (uint)bVar6 * -2 + 1;
          }
          return iVar7;
        }
        goto LAB_00676e90;
      }
    }
    return 0;
  }
LAB_00676e90:
  min_pivot = 0.0;
  dVar9 = Determinant(this,&min_pivot);
  iVar7 = ((0.0 <= dVar9) - 1) + (uint)(0.0 <= dVar9);
  if (ABS(min_pivot) <= 2.3283064365386963e-10) {
    iVar7 = 0;
  }
  if (ABS(dVar9) <= 2.3283064365386963e-10) {
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int ON_Xform::SignOfDeterminant(bool bFastTest) const
{
  if (bFastTest)
  {
    if (
      (0.0 == m_xform[3][0] && 0.0 == m_xform[3][1] && 0.0 == m_xform[3][2])
      ||
      (0.0 == m_xform[0][3] && 0.0 == m_xform[1][3] && 0.0 == m_xform[2][3])
      )
    {
      // vast majority of the 4x4 cases in practice.

      if (0.0 == m_xform[3][3])
      {
        return 0; // 100% accurate result.
      }

      // Use the simple 3x3 formula with the fewest flops.
      const double x
        = m_xform[0][0] * (m_xform[1][1] * m_xform[2][2] - m_xform[1][2] * m_xform[2][1])
        + m_xform[0][1] * (m_xform[1][2] * m_xform[2][0] - m_xform[1][0] * m_xform[2][2])
        + m_xform[0][2] * (m_xform[1][0] * m_xform[2][1] - m_xform[1][1] * m_xform[2][0]);

      if (0.0 == x)
      {
        // It is very likely we had a simple case and, mathematically, det = 0.
        // (not a 100% safe assumption, but good enough for bFastTest = true case).
        return 0;
      }

      if (fabs(x) > 1e-8)
      {
        // x is big enough that it's very likely the sign is mathematically correct.
        // (not a 100% safe assumption, but good enough for bFastTest = true case).
        const int s = ((x < 0.0) ? -1 : 1) * ((m_xform[3][3] < 0.0) ? -1 : 1);
        return s;
      }
    }
  }

  // do it a very slow and careful way
  double min_pivot = 0.0;
  const double det = this->Determinant(&min_pivot);
  if (fabs(min_pivot) > ON_ZERO_TOLERANCE && fabs(det) > ON_ZERO_TOLERANCE)
  {
    return (det < 0.0) ? -1 : 1;
  }

  return 0;
}